

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
                    LodePNGColorType colortype,uint bitdepth)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  uchar *in_00;
  
  puVar1 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  in_00 = (uchar *)0x0;
  if (puVar1 != puVar2) {
    in_00 = puVar1;
  }
  uVar3 = decode(out,w,h,in_00,(ulong)(uint)((int)puVar2 - (int)puVar1),colortype,bitdepth);
  return uVar3;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h,
                const std::vector<unsigned char>& in, LodePNGColorType colortype, unsigned bitdepth)
{
  return decode(out, w, h, in.empty() ? 0 : &in[0], (unsigned)in.size(), colortype, bitdepth);
}